

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp __thiscall rapidjson::internal::DiyFp::Normalize(DiyFp *this)

{
  long lVar1;
  uint uVar2;
  DiyFp DVar3;
  int s;
  DiyFp *this_local;
  undefined4 local_10;
  
  if (this->f != 0) {
    lVar1 = 0x3f;
    if (this->f != 0) {
      for (; this->f >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = (uint)lVar1 ^ 0x3f;
    DiyFp((DiyFp *)&this_local,this->f << ((byte)uVar2 & 0x3f),this->e - uVar2);
    DVar3._12_4_ = 0;
    DVar3.f = (uint64_t)this_local;
    DVar3.e = local_10;
    return DVar3;
  }
  __assert_fail("f != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidjson/include/rapidjson/internal/diyfp.h"
                ,0x67,"DiyFp rapidjson::internal::DiyFp::Normalize() const");
}

Assistant:

DiyFp Normalize() const {
        RAPIDJSON_ASSERT(f != 0); // https://stackoverflow.com/a/26809183/291737
#if defined(_MSC_VER) && defined(_M_AMD64)
        unsigned long index;
        _BitScanReverse64(&index, f);
        return DiyFp(f << (63 - index), e - (63 - index));
#elif defined(__GNUC__) && __GNUC__ >= 4
        int s = __builtin_clzll(f);
        return DiyFp(f << s, e - s);
#else
        DiyFp res = *this;
        while (!(res.f & (static_cast<uint64_t>(1) << 63))) {
            res.f <<= 1;
            res.e--;
        }
        return res;
#endif
    }